

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Address::ToString_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  pointer __cp;
  long lVar1;
  char ipv4 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __cp = (this->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  lVar1 = (long)(this->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__cp;
  if (lVar1 == 0x10) {
    inet_ntop(10,__cp,ipv4,0x2e);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else if (lVar1 == 4) {
    inet_ntop(2,__cp,ipv4,0x10);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToString() const
{
    static const char *kInvalidAddr = "INVALID_ADDR";
    std::string        result;

    if (mBytes.size() == kIpv4Size)
    {
        char ipv4[INET_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET, mBytes.data(), ipv4, sizeof(ipv4));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else if (mBytes.size() == kIpv6Size)
    {
        char ipv6[INET6_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET6, mBytes.data(), ipv6, sizeof(ipv6));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else
    {
        ExitNow(result = kInvalidAddr);
    }

exit:
    return result;
}